

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool Catch::
     compareEqual<std::vector<long,std::allocator<long>>,std::vector<long,std::allocator<long>>>
               (vector<long,_std::allocator<long>_> *lhs,vector<long,_std::allocator<long>_> *rhs)

{
  pointer __s1;
  pointer plVar1;
  pointer __s2;
  int iVar2;
  size_t __n;
  
  __s1 = (lhs->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
         _M_start;
  plVar1 = (lhs->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  __n = (long)plVar1 - (long)__s1;
  __s2 = (rhs->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
         _M_start;
  if (__n != (long)(rhs->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)__s2) {
    return false;
  }
  if (plVar1 != __s1) {
    iVar2 = bcmp(__s1,__s2,__n);
    return iVar2 == 0;
  }
  return true;
}

Assistant:

auto compareEqual( LhsT const& lhs, RhsT const& rhs ) -> bool { return static_cast<bool>(lhs == rhs); }